

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall Selector::removeListener(Selector *this,int fd,SelectorListener *listener)

{
  bool bVar1;
  iterator i;
  AutoLock l;
  Node *local_48;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock);
  local_48 = ((this->mList).mHead)->next;
  if (local_48 != (this->mList).mTail) {
    bVar1 = false;
    do {
      if (local_48->val->mFd == fd) {
        operator_delete(local_48->val,0x18);
        JetHead::list<Selector::ListenerNode_*>::iterator::erase(&local_40);
        local_48 = local_40.mNode;
        bVar1 = true;
      }
      else {
        local_48 = local_48->next;
      }
    } while (local_48 != (this->mList).mTail);
    if (bVar1) {
      updateListeners(this);
    }
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void Selector::removeListener( int fd, SelectorListener *listener )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	AutoLock l( mLock );
	ListenerNode n( fd, NULL );
	bool update = false;
	
	JetHead::list<ListenerNode*>::iterator i = mList.begin(); 
	while (i != mList.end())
	{
		if (*(*i) == n)
		{
			update = true;
			delete *i;
			i = i.erase();
		} 
		else 
		{
			++i;
		}
	}
		
	if ( update )
	{
		updateListeners();		
	}
}